

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_1c02d::CpuTest_jmp_Test::TestBody(CpuTest_jmp_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *rhs;
  undefined2 uVar1;
  undefined2 uVar2;
  int iVar3;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar4;
  ActionInterface<unsigned_char_(unsigned_short)> *pAVar5;
  pointer *__ptr;
  char cVar6;
  _func_int *message;
  AssertionResult gtest_ar;
  _Any_data local_98;
  code *local_88;
  int *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_68 [8];
  MatcherBase<unsigned_short> local_60;
  MatcherBase<unsigned_short> local_48;
  
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'L');
  (this->super_CpuTest).expected.pc = 0x1234;
  this_00 = &(this->super_CpuTest).mmu;
  uVar1 = (this->super_CpuTest).registers.pc;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_48,uVar1 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_48);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x136,"mmu","read_byte(registers.pc + 1u)");
  local_78 = (int *)operator_new(4);
  *local_78 = 0x34;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_70,local_78);
  pAVar5 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar3 = *local_78;
  *(int *)&pAVar5[1]._vptr_ActionInterface = iVar3;
  *(char *)((long)&pAVar5[1]._vptr_ActionInterface + 4) = (char)iVar3;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_98,pAVar5);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar4,(Action<unsigned_char_(unsigned_short)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  rhs = &(this->super_CpuTest).registers;
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_48);
  uVar2 = rhs->pc;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_48,uVar2 + 2);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_48);
  testing::internal::GetWithoutMatchers();
  pTVar4 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x137,"mmu","read_byte(registers.pc + 2u)");
  local_78 = (int *)operator_new(4);
  *local_78 = 0x12;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_70,local_78);
  pAVar5 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar3 = *local_78;
  *(int *)&pAVar5[1]._vptr_ActionInterface = iVar3;
  *(char *)((long)&pAVar5[1]._vptr_ActionInterface + 4) = (char)iVar3;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_98,pAVar5);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar4,(Action<unsigned_char_(unsigned_short)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_48);
  cVar6 = '\x03';
  do {
    (*(((this->super_CpuTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar6 = cVar6 + -1;
  } while (cVar6 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_68,"expected","registers",&(this->super_CpuTest).expected,rhs);
  if (local_68[0] == '\0') {
    testing::Message::Message((Message *)&local_98);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x13b,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_98._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_98._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TEST_F(CpuTest, jmp) {
    stage_instruction(JMP);
    expected.pc = 0x1234;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1u)).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2u)).WillOnce(Return(0x12));

    step_execution(3);

    EXPECT_EQ(expected, registers);
}